

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O3

void __thiscall QPlainTextEdit::keyReleaseEvent(QPlainTextEdit *this,QKeyEvent *e)

{
  long lVar1;
  QWidgetTextControl *this_00;
  QWidget *this_01;
  bool bVar2;
  TextInteractionFlags TVar3;
  QStyle *pQVar4;
  QPlainTextEditPrivate *d;
  
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  this_00 = *(QWidgetTextControl **)(lVar1 + 800);
  if (this_00 != (QWidgetTextControl *)0x0) {
    TVar3 = QWidgetTextControl::textInteractionFlags(this_00);
    if (((uint)TVar3.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
               super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) != 0) {
      this_01 = *(QWidget **)(lVar1 + 8);
      bVar2 = QApplication::autoSipEnabled(QCoreApplication::self);
      if (bVar2) {
        pQVar4 = QWidget::style(this_01);
        (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x5f,0,this_01,0);
        QGuiApplication::inputMethod();
        QInputMethod::show();
      }
    }
  }
  QWidget::keyReleaseEvent((QWidget *)this,e);
  return;
}

Assistant:

void QPlainTextEdit::keyReleaseEvent(QKeyEvent *e)
{
    Q_D(QPlainTextEdit);
    if (!isReadOnly())
        d->handleSoftwareInputPanel();

#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled()) {
        if (!e->isAutoRepeat() && e->key() == Qt::Key_Back
            && d->deleteAllTimer.isActive()) {
            d->deleteAllTimer.stop();
            QTextCursor cursor = d->control->textCursor();
            QTextBlockFormat blockFmt = cursor.blockFormat();

            QTextList *list = cursor.currentList();
            if (list && cursor.atBlockStart()) {
                list->remove(cursor.block());
            } else if (cursor.atBlockStart() && blockFmt.indent() > 0) {
                blockFmt.setIndent(blockFmt.indent() - 1);
                cursor.setBlockFormat(blockFmt);
            } else {
                cursor.deletePreviousChar();
            }
            setTextCursor(cursor);
        }
    }
#else
    QWidget::keyReleaseEvent(e);
#endif
}